

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void wasm::Thread::mainLoop(void *self_)

{
  bool bVar1;
  ThreadWorkState TVar2;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lock_1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  Thread *self;
  void *self__local;
  
  lock._8_8_ = self_;
  do {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_28,(mutex_type *)(lock._8_8_ + 0x10));
    bVar1 = std::function::operator_cast_to_bool((function *)(lock._8_8_ + 0x70));
    if (bVar1) {
      do {
        TVar2 = std::function<wasm::ThreadWorkState_()>::operator()
                          ((function<wasm::ThreadWorkState_()> *)(lock._8_8_ + 0x70));
      } while (TVar2 == More);
      std::function<wasm::ThreadWorkState_()>::operator=
                ((function<wasm::ThreadWorkState_()> *)(lock._8_8_ + 0x70),(nullptr_t)0x0);
LAB_0254b9e8:
      lock_1._M_owns = false;
      lock_1._9_3_ = 0;
    }
    else {
      if ((*(byte *)(lock._8_8_ + 0x68) & 1) == 0) goto LAB_0254b9e8;
      lock_1._M_owns = true;
      lock_1._9_3_ = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
    if (lock_1._8_4_ != 0) {
      return;
    }
    ThreadPool::notifyThreadIsReady(*(ThreadPool **)lock._8_8_);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_48,(mutex_type *)(lock._8_8_ + 0x10));
    if (((*(byte *)(lock._8_8_ + 0x68) & 1) == 0) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)(lock._8_8_ + 0x70)), !bVar1)) {
      std::condition_variable::wait((unique_lock *)(lock._8_8_ + 0x38));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  } while( true );
}

Assistant:

void Thread::mainLoop(void* self_) {
  auto* self = static_cast<Thread*>(self_);
  while (1) {
    DEBUG_THREAD("checking for work\n");
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (self->doWork) {
        DEBUG_THREAD("doing work\n");
        // run tasks until they are all done
        while (self->doWork() == ThreadWorkState::More) {
        }
        self->doWork = nullptr;
      } else if (self->done) {
        DEBUG_THREAD("done\n");
        return;
      }
    }
    self->parent->notifyThreadIsReady();
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (!self->done && !self->doWork) {
        DEBUG_THREAD("thread waiting\n");
        self->condition.wait(lock);
      }
    }
  }
}